

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O3

void __thiscall BamTools::SamSequence::SamSequence(SamSequence *this)

{
  char *__end;
  
  (this->AssemblyID)._M_dataplus._M_p = (pointer)&(this->AssemblyID).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  (this->Checksum)._M_dataplus._M_p = (pointer)&(this->Checksum).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Checksum,"","");
  (this->Length)._M_dataplus._M_p = (pointer)&(this->Length).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Length,"");
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Name,"");
  (this->Species)._M_dataplus._M_p = (pointer)&(this->Species).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Species,"");
  (this->URI)._M_dataplus._M_p = (pointer)&(this->URI).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->URI,"");
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SamSequence::SamSequence(void)
    : AssemblyID("")
    , Checksum("")
    , Length("")
    , Name("")
    , Species("")
    , URI("")
{ }